

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int vrna_E_ext_loop_3(vrna_fold_compound_t *fc,int i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vrna_callback_hc_evaluate *evaluate_00;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  undefined1 local_e8 [8];
  sc_wrapper_f3 sc_wrapper;
  default_data hc_dat_local;
  vrna_callback_hc_evaluate *evaluate;
  vrna_md_t *md;
  vrna_param_t *P;
  int with_gquad;
  int dangle_model;
  int en;
  int e;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    fc_local._4_4_ = 10000000;
  }
  else {
    iVar1 = (fc->params->model_details).dangles;
    iVar2 = (fc->params->model_details).gquad;
    evaluate_00 = prepare_hc_default_window(fc,(default_data *)&sc_wrapper.user_data_comparative);
    init_sc_wrapper_f3(fc,i,(sc_wrapper_f3 *)local_e8);
    iVar3 = reduce_f3_up(fc,i,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative,
                         (sc_wrapper_f3 *)local_e8);
    if (iVar1 == 0) {
      local_104 = decompose_f3_ext_stem_d0
                            (fc,i,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f3 *)local_e8);
      if (iVar3 < local_104) {
        local_104 = iVar3;
      }
      dangle_model = local_104;
    }
    else if (iVar1 == 2) {
      local_108 = decompose_f3_ext_stem_d2
                            (fc,i,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f3 *)local_e8);
      if (iVar3 < local_108) {
        local_108 = iVar3;
      }
      dangle_model = local_108;
    }
    else {
      local_10c = decompose_f3_ext_stem_d1
                            (fc,i,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative,
                             (sc_wrapper_f3 *)local_e8);
      if (iVar3 < local_10c) {
        local_10c = iVar3;
      }
      dangle_model = local_10c;
    }
    if (iVar2 != 0) {
      local_110 = add_f3_gquad(fc,i,evaluate_00,(default_data *)&sc_wrapper.user_data_comparative,
                               (sc_wrapper_f3 *)local_e8);
      if (dangle_model < local_110) {
        local_110 = dangle_model;
      }
      dangle_model = local_110;
    }
    free_sc_wrapper_f3((sc_wrapper_f3 *)local_e8);
    fc_local._4_4_ = dangle_model;
  }
  return fc_local._4_4_;
}

Assistant:

PUBLIC int
vrna_E_ext_loop_3(vrna_fold_compound_t  *fc,
                  int                   i)
{
  if (fc) {
    int                       e, en, dangle_model, with_gquad;
    vrna_param_t              *P;
    vrna_md_t                 *md;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f3      sc_wrapper;

    e = INF;

    P             = fc->params;
    md            = &(P->model_details);
    dangle_model  = md->dangles;
    with_gquad    = md->gquad;
    evaluate      = prepare_hc_default_window(fc, &hc_dat_local);

    init_sc_wrapper_f3(fc, i, &sc_wrapper);

    /* first case: i stays unpaired */
    e = reduce_f3_up(fc, i, evaluate, &hc_dat_local, &sc_wrapper);

    /* decompose into stem followed by exterior loop part */
    switch (dangle_model) {
      case 0:
        en  = decompose_f3_ext_stem_d0(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      case 2:
        en  = decompose_f3_ext_stem_d2(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;

      default:
        en  = decompose_f3_ext_stem_d1(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
        e   = MIN2(e, en);
        break;
    }

    if (with_gquad) {
      en  = add_f3_gquad(fc, i, evaluate, &hc_dat_local, &sc_wrapper);
      e   = MIN2(e, en);
    }

    free_sc_wrapper_f3(&sc_wrapper);

    return e;
  }

  return INF;
}